

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drumtab.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  size_t __n;
  void *__buf;
  allocator local_99;
  string local_98 [32];
  MidiFile outputfile;
  
  smf::MidiFile::MidiFile(&outputfile);
  smf::MidiFile::absoluteTicks(&outputfile);
  smf::MidiFile::setTicksPerQuarterNote(&outputfile,0x78);
  AddDrumTrack(&outputfile,(int *)&DAT_00119010,0x3b,0x1e);
  AddDrumTrack(&outputfile,(int *)&DAT_001190e0,0x26,0x1e);
  __n = 0x1e;
  AddDrumTrack(&outputfile,(int *)&DAT_001191b0,0x29,0x1e);
  smf::MidiFile::sortTracks(&outputfile);
  std::__cxx11::string::string(local_98,"rhythm.mid",&local_99);
  smf::MidiFile::write(&outputfile,(int)local_98,__buf,__n);
  std::__cxx11::string::~string(local_98);
  smf::MidiFile::~MidiFile(&outputfile);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
   MidiFile outputfile;        // create an empty MIDI file with one track
   outputfile.absoluteTicks(); // time information stored as absolute time
                               // (will be coverted to delta time when written)
   outputfile.setTicksPerQuarterNote(QUARTER);

   int hhdata[50] = {'x', '-', 'x', '-', 'x', '-', 'x', '-', -1};
   int sndata[50] = {'-', '-', 'x', '-', '-', '-', 'x', '-', -1};
   int bsdata[50] = {'x', '-', '-', '-', 'x', '-', '-', '-', -1};

   AddDrumTrack(outputfile, hhdata, HIGH_HAT,  SIXTEENTH);
   AddDrumTrack(outputfile, sndata, SNARE,     SIXTEENTH);
   AddDrumTrack(outputfile, bsdata, BASS_DRUM, SIXTEENTH);

   outputfile.sortTracks();         // make sure data is in correct order
   outputfile.write("rhythm.mid");  // write Standard MIDI File twinkle.mid

   return 0;
}